

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O2

Vector3<double> * phyr::cross<double>(Vector3<double> *v1,Vector3<double> *v2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Vector3<double> *in_RDI;
  
  dVar1 = v1->x;
  dVar2 = v2->x;
  dVar3 = v1->y;
  dVar4 = v1->z;
  dVar5 = v2->y;
  dVar6 = v2->z;
  in_RDI->x = dVar6 * dVar3 - dVar4 * dVar5;
  in_RDI->y = dVar2 * dVar4 - dVar1 * dVar6;
  in_RDI->z = dVar1 * dVar5 - dVar2 * dVar3;
  return in_RDI;
}

Assistant:

inline Vector3<T> cross(const Vector3<T>& v1, const Vector3<T>& v2) {
    ASSERT(!v1.hasNaNs() && !v2.hasNaNs());
    double x1 = v1.x, y1 = v1.y, z1 = v1.z;
    double x2 = v2.x, y2 = v2.y, z2 = v2.z;
    return Vector3<T>((y1 * z2 - z1 * y2), (z1 * x2 - x1 * z2), (x1 * y2 - y1 * x2));
}